

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::happens_before
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *identifier)

{
  bool bVar1;
  TID tid;
  pointer prVar2;
  VC_ID id;
  ThreadState *thr;
  iterator local_98;
  undefined1 local_58 [8];
  iterator it;
  lock_guard<std::shared_mutex> exLockT;
  void *identifier_local;
  tls_t tls_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  exLockT._M_device = (mutex_type *)identifier;
  std::lock_guard<std::shared_mutex>::lock_guard
            ((lock_guard<std::shared_mutex> *)&it.it_end_.field_1,&this->g_lock);
  phmap::container_internal::
  parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
  ::find<void*>((iterator *)local_58,&this->happens_states,&exLockT._M_device);
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  ::end(&local_98,
        (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
         *)&this->happens_states);
  bVar1 = phmap::container_internal::operator==((iterator *)local_58,&local_98);
  if (bVar1) {
    create_happens((iterator *)&thr,this,exLockT._M_device);
    memcpy(local_58,&thr,0x30);
  }
  ThreadState::inc_vc((ThreadState *)tls);
  prVar2 = phmap::container_internal::
           parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           ::iterator::operator->((iterator *)local_58);
  tid = ThreadState::get_tid((ThreadState *)tls);
  id = ThreadState::return_own_id((ThreadState *)tls);
  VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
            (&prVar2->second,tid,id);
  std::lock_guard<std::shared_mutex>::~lock_guard
            ((lock_guard<std::shared_mutex> *)&it.it_end_.field_1);
  return;
}

Assistant:

void happens_before(tls_t tls, void* identifier) final {
    std::lock_guard<LockT> exLockT(g_lock);
    auto it = happens_states.find(identifier);
    if (it == happens_states.end()) {
      it = create_happens(identifier);
    }

    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);

    thr->inc_vc();  // increment clock of thread and update happens state
    it->second.update(thr->get_tid(), thr->return_own_id());
  }